

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O1

AssertionResult
testing::internal::CmpHelperEQFailure<char[4],std::__cxx11::string>
          (char *lhs_expression,char *rhs_expression,char (*lhs) [4],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rhs)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_01;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar1
  ;
  testing *in_R8;
  AssertionResult AVar2;
  undefined1 local_60 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  local_60._0_8_ = rhs;
  PrintToString<char_const*>((string *)&local_40,(testing *)local_60,(char **)lhs);
  PrintToString<std::__cxx11::string>((string *)local_60,in_R8,value);
  testing::internal::EqFailure
            (lhs_expression,rhs_expression,(string *)lhs,(string *)local_40._M_local_buf,
             SUB81(local_60,0));
  sVar1.ptr_ = extraout_RDX;
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_60 + 0x10)) {
    operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
    sVar1.ptr_ = extraout_RDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_allocated_capacity != &local_30) {
    operator_delete((void *)local_40._M_allocated_capacity,local_30._M_allocated_capacity + 1);
    sVar1.ptr_ = extraout_RDX_01;
  }
  AVar2.message_.ptr_ = sVar1.ptr_;
  AVar2._0_8_ = lhs_expression;
  return AVar2;
}

Assistant:

AssertionResult CmpHelperEQFailure(const char* lhs_expression,
                                   const char* rhs_expression,
                                   const T1& lhs, const T2& rhs) {
  return EqFailure(lhs_expression,
                   rhs_expression,
                   FormatForComparisonFailureMessage(lhs, rhs),
                   FormatForComparisonFailureMessage(rhs, lhs),
                   false);
}